

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O1

int32 dumbfile_getnc(char *ptr,int32 n,DUMBFILE *f)

{
  _func_int32_char_ptr_int32_void_ptr *p_Var1;
  bool bVar2;
  int32 iVar3;
  int iVar4;
  int iVar5;
  
  if (f->pos < 0) {
    n = -1;
  }
  else {
    p_Var1 = f->dfs->getnc;
    if (p_Var1 == (_func_int32_char_ptr_int32_void_ptr *)0x0) {
      if (n < 1) {
        n = 0;
      }
      else {
        iVar5 = 0;
        do {
          iVar4 = (*f->dfs->getc)(f->file);
          if (iVar4 < 0) {
            f->pos = -1;
            return iVar5;
          }
          *ptr = (char)iVar4;
          ptr = ptr + 1;
          iVar5 = iVar5 + 1;
        } while (n != iVar5);
      }
    }
    else {
      iVar3 = (*p_Var1)(ptr,n,f->file);
      bVar2 = iVar3 < n;
      n = iVar3;
      if (bVar2) {
        f->pos = -1;
        if (iVar3 < 1) {
          return 0;
        }
        return iVar3;
      }
    }
    f->pos = f->pos + (long)n;
  }
  return n;
}

Assistant:

int32 DUMBEXPORT dumbfile_getnc(char *ptr, int32 n, DUMBFILE *f)
{
	int32 rv;

	ASSERT(f);
	ASSERT(n >= 0);

	if (f->pos < 0)
		return -1;

	if (f->dfs->getnc) {
		rv = (*f->dfs->getnc)(ptr, n, f->file);
		if (rv < n) {
			f->pos = -1;
			return MAX(rv, 0);
		}
	} else {
		for (rv = 0; rv < n; rv++) {
			int c = (*f->dfs->getc)(f->file);
			if (c < 0) {
				f->pos = -1;
				return rv;
			}
			*ptr++ = c;
		}
	}

	f->pos += rv;

	return rv;
}